

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

PointerReader *
capnp::_::PointerReader::getRoot
          (PointerReader *__return_storage_ptr__,SegmentReader *segment,CapTableReader *capTable,
          word *location,int nestingLimit)

{
  uint64_t uVar1;
  DebugExpression<bool> local_11;
  Fault f;
  
  if (segment == (SegmentReader *)0x0) {
LAB_00178f45:
    __return_storage_ptr__->segment = segment;
    __return_storage_ptr__->capTable = capTable;
    __return_storage_ptr__->pointer = (WirePointer *)location;
    __return_storage_ptr__->nestingLimit = nestingLimit;
    return __return_storage_ptr__;
  }
  if (((long)location - (long)(segment->ptr).ptr >> 3) + 1U <= (segment->ptr).size_) {
    uVar1 = segment->readLimiter->limit;
    if (uVar1 != 0) {
      segment->readLimiter->limit = uVar1 - 1;
      goto LAB_00178f45;
    }
    (*segment->arena->_vptr_Arena[3])(segment->arena);
  }
  local_11.value = false;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[29]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xa94,FAILED,"WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS)",
             "_kjCondition,\"Root location out-of-bounds.\"",&local_11,
             (char (*) [29])"Root location out-of-bounds.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

static KJ_ALWAYS_INLINE(bool boundsCheck(
      SegmentReader* segment, const word* start, WordCountN<31> size)) {
    // If segment is null, this is an unchecked message, so we don't do bounds checks.
    return segment == nullptr || segment->checkObject(start, size);
  }